

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<
          (ChArchiveOut *this,ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *bVal)

{
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_30;
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *local_18;
  ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this;
  ChNameValue<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::ChNameValue(&local_30,bVal);
  out<Eigen::Matrix<double,_1,_1,1,_1,_1>>(this,&local_30);
  ChNameValue<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }